

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssvectorbase.h
# Opt level: O0

void __thiscall
soplex::
SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::clear(SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        *this)

{
  bool bVar1;
  cpp_dec_float<200U,_int,_void> *in_RDI;
  int i;
  long_long_type in_stack_ffffffffffffffc8;
  int local_24;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_ffffffffffffffe8;
  
  bVar1 = isSetup((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)in_RDI);
  if (bVar1) {
    for (local_24 = 0; local_24 < *(int *)((long)(in_RDI->data)._M_elems + 8);
        local_24 = local_24 + 1) {
      std::
      vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ::operator[]((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    *)((long)(in_RDI->data)._M_elems + 0x20),
                   (long)(*(int **)((long)(in_RDI->data)._M_elems + 0x10))[local_24]);
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                (in_RDI,in_stack_ffffffffffffffc8);
    }
  }
  else {
    VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::clear(in_stack_ffffffffffffffe8);
  }
  IdxSet::clear((IdxSet *)in_RDI);
  *(undefined1 *)((long)(in_RDI->data)._M_elems + 0x38) = 1;
  return;
}

Assistant:

void clear()
   {
      if(isSetup())
      {
         for(int i = 0; i < num; ++i)
            VectorBase<R>::val[idx[i]] = 0;
      }
      else
         VectorBase<R>::clear();

      IdxSet::clear();
      setupStatus = true;

      assert(isConsistent());
   }